

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool AdjustCurve(ON_Curve *crv,ON_3dPoint *P0,ON_3dPoint *P1)

{
  ON_3dVector axis;
  ON_3dPoint center;
  bool bVar1;
  uint uVar2;
  int iVar3;
  ON_LineCurve *pOVar4;
  ON_CurveProxy *pOVar5;
  ON_PolylineCurve *crv_00;
  ON_NurbsCurve *crv_01;
  ON_PolyCurve *crv_02;
  double dVar6;
  double dVar7;
  double dVar8;
  byte local_60f;
  byte local_60e;
  byte local_60d;
  byte local_60c;
  byte local_60b;
  byte local_60a;
  byte local_609;
  undefined1 local_5a8 [8];
  ON_Xform T;
  double cosa;
  double sina;
  ON_3dVector Axis;
  ON_3dVector VP;
  ON_3dVector VA;
  undefined1 local_488 [8];
  ON_3dPoint C;
  ON_3dPoint local_410;
  ON_3dPoint local_3f8;
  undefined1 local_3e0 [8];
  ON_Xform T_3;
  ON_3dPoint local_348;
  double local_330;
  double scale;
  double local_320;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  ON_3dPoint local_2f8;
  ON_3dPoint local_2e0;
  undefined1 local_2c8 [8];
  ON_Xform T_2;
  ON_3dVector TVec;
  undefined1 local_218 [8];
  ON_3dPoint Pc;
  undefined1 local_1e8 [8];
  ON_3dPoint Ac;
  double plen;
  double alen;
  undefined1 local_160 [8];
  ON_3dPoint A1;
  ON_3dPoint A0;
  ON_PolyCurve *plyc;
  ON_NurbsCurve *nc;
  ON_PolylineCurve *plc;
  ON_Xform T_1;
  ON_3dVector TVec_1;
  ON_3dPoint P;
  ON_CurveProxy *pc;
  ON_LineCurve *lc;
  ON_3dPoint *P1_local;
  ON_3dPoint *P0_local;
  ON_Curve *crv_local;
  
  pOVar4 = ON_LineCurve::Cast((ON_Object *)crv);
  if (pOVar4 == (ON_LineCurve *)0x0) {
    pOVar5 = ON_CurveProxy::Cast((ON_Object *)crv);
    if (pOVar5 == (ON_CurveProxy *)0x0) {
      uVar2 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])();
      if ((uVar2 & 1) == 0) {
        crv_00 = ON_PolylineCurve::Cast((ON_Object *)crv);
        if (crv_00 == (ON_PolylineCurve *)0x0) {
          crv_01 = ON_NurbsCurve::Cast((ON_Object *)crv);
          if (crv_01 == (ON_NurbsCurve *)0x0) {
            crv_02 = ON_PolyCurve::Cast((ON_Object *)crv);
            if (crv_02 == (ON_PolyCurve *)0x0) {
              ON_Curve::PointAtStart((ON_3dPoint *)&A1.z,crv);
              ON_Curve::PointAtEnd((ON_3dPoint *)local_160,crv);
              dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)&A1.z,P0);
              if ((dVar6 < 1.490116119385e-08) &&
                 (dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)local_160,P1),
                 dVar6 < 1.490116119385e-08)) {
                uVar2 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])();
                local_609 = 1;
                if ((uVar2 & 1) == 0) {
                  iVar3 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
                  local_609 = (byte)iVar3;
                }
                return (bool)(-(local_609 & 1) & 1);
              }
              dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)&A1.z,(ON_3dPoint *)local_160);
              dVar7 = ON_3dPoint::DistanceTo(P0,P1);
              if ((dVar7 * 0.1 <= dVar6) && (dVar6 * 0.1 <= dVar7)) {
                ON_3dPoint::operator+
                          ((ON_3dPoint *)&Pc.z,(ON_3dPoint *)&A1.z,(ON_3dPoint *)local_160);
                operator*((ON_3dPoint *)local_1e8,0.5,(ON_3dPoint *)&Pc.z);
                ON_3dPoint::operator+((ON_3dPoint *)&TVec.z,P0,P1);
                operator*((ON_3dPoint *)local_218,0.5,(ON_3dPoint *)&TVec.z);
                ON_3dPoint::operator-
                          ((ON_3dVector *)(T_2.m_xform[3] + 3),(ON_3dPoint *)local_218,
                           (ON_3dPoint *)local_1e8);
                dVar8 = ON_3dVector::Length((ON_3dVector *)(T_2.m_xform[3] + 3));
                if (1.490116119385e-08 < dVar8) {
                  ON_Xform::TranslationTransformation
                            ((ON_Xform *)local_2c8,(ON_3dVector *)(T_2.m_xform[3] + 3));
                  (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(crv,local_2c8);
                }
                ON_Curve::PointAtStart(&local_2e0,crv);
                A1.z = local_2e0.x;
                ON_Curve::PointAtEnd(&local_2f8,crv);
                local_160 = (undefined1  [8])local_2f8.x;
                A1.x = local_2f8.y;
                A1.y = local_2f8.z;
                dVar8 = ON_3dPoint::DistanceTo((ON_3dPoint *)&A1.z,P0);
                if ((dVar8 < 1.490116119385e-08) &&
                   (dVar8 = ON_3dPoint::DistanceTo((ON_3dPoint *)local_160,P1),
                   dVar8 < 1.490116119385e-08)) {
                  local_310 = P0->x;
                  local_308 = P0->y;
                  local_300 = P0->z;
                  uVar2 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])();
                  local_60b = 1;
                  if ((uVar2 & 1) == 0) {
                    scale = P1->x;
                    local_320 = P1->y;
                    local_318 = P1->z;
                    iVar3 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
                    local_60b = (byte)iVar3;
                  }
                  return (bool)(-(local_60b & 1) & 1);
                }
                if (1.490116119385e-08 < ABS(dVar7 - dVar6)) {
                  local_330 = dVar7 / dVar6;
                  ON_3dPoint::operator+
                            ((ON_3dPoint *)(T_3.m_xform[3] + 3),(ON_3dPoint *)&A1.z,
                             (ON_3dPoint *)local_160);
                  operator*(&local_348,0.5,(ON_3dPoint *)(T_3.m_xform[3] + 3));
                  local_1e8 = (undefined1  [8])local_348.x;
                  Ac.x = local_348.y;
                  Ac.y = local_348.z;
                  ON_Xform::ScaleTransformation
                            ((ON_Xform *)local_3e0,(ON_3dPoint *)local_1e8,local_330);
                  (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(crv,local_3e0);
                }
                ON_Curve::PointAtStart(&local_3f8,crv);
                A1.z = local_3f8.x;
                ON_Curve::PointAtEnd(&local_410,crv);
                local_160 = (undefined1  [8])local_410.x;
                A1.x = local_410.y;
                A1.y = local_410.z;
                dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)&A1.z,P0);
                if ((dVar6 < 1.490116119385e-08) &&
                   (dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)local_160,P1),
                   dVar6 < 1.490116119385e-08)) {
                  uVar2 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])();
                  local_60c = 1;
                  if ((uVar2 & 1) == 0) {
                    iVar3 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
                    local_60c = (byte)iVar3;
                  }
                  return (bool)(-(local_60c & 1) & 1);
                }
                if (dVar7 < 1.490116119385e-08) {
                  uVar2 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])();
                  local_60d = 1;
                  if ((uVar2 & 1) == 0) {
                    C.z = P1->x;
                    iVar3 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
                    local_60d = (byte)iVar3;
                  }
                  return (bool)(-(local_60d & 1) & 1);
                }
                ON_3dPoint::operator+
                          ((ON_3dPoint *)&VA.z,(ON_3dPoint *)local_218,(ON_3dPoint *)local_1e8);
                operator*((ON_3dPoint *)local_488,0.5,(ON_3dPoint *)&VA.z);
                ON_3dPoint::operator-
                          ((ON_3dVector *)&VP.z,(ON_3dPoint *)&A1.z,(ON_3dPoint *)local_488);
                ON_3dVector::Unitize((ON_3dVector *)&VP.z);
                ON_3dPoint::operator-((ON_3dVector *)&Axis.z,P0,(ON_3dPoint *)local_488);
                ON_3dVector::Unitize((ON_3dVector *)&Axis.z);
                ON_CrossProduct((ON_3dVector *)&sina,(ON_3dVector *)&VP.z,(ON_3dVector *)&Axis.z);
                dVar6 = ON_3dVector::Length((ON_3dVector *)&sina);
                if (dVar6 < 1.490116119385e-08) {
                  uVar2 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])();
                  local_60e = 1;
                  if ((uVar2 & 1) == 0) {
                    iVar3 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
                    local_60e = (byte)iVar3;
                  }
                  return (bool)(-(local_60e & 1) & 1);
                }
                ON_3dVector::Unitize((ON_3dVector *)&sina);
                T.m_xform[3][3] =
                     ON_3dVector::operator*((ON_3dVector *)&VP.z,(ON_3dVector *)&Axis.z);
                ON_Xform::ON_Xform((ON_Xform *)local_5a8);
                axis.y = Axis.x;
                axis.x = sina;
                axis.z = Axis.y;
                center.y = C.x;
                center.x = (double)local_488;
                center.z = C.y;
                ON_Xform::Rotation((ON_Xform *)local_5a8,dVar6,T.m_xform[3][3],axis,center);
                (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(crv,local_5a8);
                uVar2 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])();
                local_60f = 1;
                if ((uVar2 & 1) == 0) {
                  iVar3 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
                  local_60f = (byte)iVar3;
                }
                return (bool)(-(local_60f & 1) & 1);
              }
              uVar2 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x39])();
              local_60a = 1;
              if ((uVar2 & 1) == 0) {
                Ac.z = P1->x;
                iVar3 = (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
                local_60a = (byte)iVar3;
              }
              crv_local._7_1_ = (bool)(-(local_60a & 1) & 1);
            }
            else {
              crv_local._7_1_ = AdjustPolyCurve(crv_02,P0,P1);
            }
          }
          else {
            AdjustNurbsCurve(crv_01,P0,P1);
            crv_local._7_1_ = true;
          }
        }
        else {
          AdjustPolylineCurve(crv_00,P0,P1);
          crv_local._7_1_ = true;
        }
      }
      else {
        bVar1 = ON_3dPoint::operator!=(P0,P1);
        if (bVar1) {
          crv_local._7_1_ = false;
        }
        else {
          ON_Curve::PointAtStart((ON_3dPoint *)&TVec_1.z,crv);
          ON_3dPoint::operator-((ON_3dVector *)(T_1.m_xform[3] + 3),P0,(ON_3dPoint *)&TVec_1.z);
          dVar6 = ON_3dVector::Length((ON_3dVector *)(T_1.m_xform[3] + 3));
          if (dVar6 <= 1.490116119385e-08) {
            crv_local._7_1_ = false;
          }
          else {
            ON_Xform::TranslationTransformation
                      ((ON_Xform *)&plc,(ON_3dVector *)(T_1.m_xform[3] + 3));
            (*(crv->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1c])(crv,&plc);
            crv_local._7_1_ = true;
          }
        }
      }
    }
    else {
      crv_local._7_1_ = false;
    }
  }
  else {
    (*(pOVar4->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x39])();
    (*(pOVar4->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x3a])();
    crv_local._7_1_ = true;
  }
  return crv_local._7_1_;
}

Assistant:

static bool AdjustCurve(ON_Curve& crv, 
                        const ON_3dPoint& P0,
                        const ON_3dPoint& P1)

{
  ON_LineCurve* lc = ON_LineCurve::Cast(&crv);
  if (lc){
    lc->SetStartPoint(P0);
    lc->SetEndPoint(P1);
    return true;
  }

  ON_CurveProxy* pc = ON_CurveProxy::Cast(&crv);
  if (pc)
    return false;

  if (crv.IsClosed()){
    if (P0 != P1)
      return false;
    ON_3dPoint P = crv.PointAtStart();
    ON_3dVector TVec = P0-P;
    if (TVec.Length() > ON_SQRT_EPSILON){
      ON_Xform T(ON_Xform::TranslationTransformation(TVec));
      crv.Transform(T);
    }
    else
      return false;
    return true;
  }

  ON_PolylineCurve* plc = ON_PolylineCurve::Cast(&crv);
  if (plc) {
    AdjustPolylineCurve(*plc, P0, P1);
    return true;
  }

  ON_NurbsCurve* nc = ON_NurbsCurve::Cast(&crv);
  if (nc){
    AdjustNurbsCurve(*nc, P0, P1);
    return true;
  }

  ON_PolyCurve* plyc = ON_PolyCurve::Cast(&crv);
  if (plyc){
    return AdjustPolyCurve(*plyc, P0, P1);
  }

  ON_3dPoint A0 = crv.PointAtStart();
  ON_3dPoint A1 = crv.PointAtEnd();

  if (A0.DistanceTo(P0) < ON_SQRT_EPSILON && A1.DistanceTo(P1) < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  double alen = A0.DistanceTo(A1);
  double plen = P0.DistanceTo(P1);
  if (alen < 0.1*plen || plen < 0.1*alen){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  ON_3dPoint Ac = 0.5*(A0+A1);
  ON_3dPoint Pc = 0.5*(P0+P1);
  ON_3dVector TVec = Pc-Ac;
  if (TVec.Length() > ON_SQRT_EPSILON){
    const ON_Xform T(ON_Xform::TranslationTransformation(TVec));
    crv.Transform(T);
  }

  A0 = crv.PointAtStart();
  A1 = crv.PointAtEnd();
  if (A0.DistanceTo(P0) < ON_SQRT_EPSILON && A1.DistanceTo(P1) < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  if (fabs(plen - alen) > ON_SQRT_EPSILON){
    double scale = plen/alen;
    Ac = 0.5*(A0+A1);
    ON_Xform T(ON_Xform::ScaleTransformation(Ac, scale));
    crv.Transform(T);
  }

  A0 = crv.PointAtStart();
  A1 = crv.PointAtEnd();
  if (A0.DistanceTo(P0) < ON_SQRT_EPSILON && A1.DistanceTo(P1) < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  if (plen < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }

  ON_3dPoint C = 0.5*(Pc+Ac);
  ON_3dVector VA = A0-C;
  VA.Unitize();
  ON_3dVector VP = P0-C;
  VP.Unitize();

  ON_3dVector Axis = ON_CrossProduct(VA, VP);
  double sina = Axis.Length();
  if (sina < ON_SQRT_EPSILON){
    return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
  }
  Axis.Unitize();
  double cosa = VA*VP;

  ON_Xform T;
  T.Rotation(sina, cosa, Axis, C);
  crv.Transform(T);
  return (crv.SetStartPoint(P0) || crv.SetEndPoint(P1)) ? true : false;
}